

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srt.c
# Opt level: O0

void srt_dump(srt_t *srt)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  utf8_char_t *puVar10;
  long in_RDI;
  int ms2;
  int ms1;
  int ss2;
  int ss1;
  int mm2;
  int mm1;
  int hh2;
  int hh1;
  vtt_block_t *block;
  int i;
  int local_48;
  uint local_44;
  int local_40;
  uint local_3c;
  int local_38;
  uint local_34;
  int local_30;
  uint local_2c;
  _vtt_block_t *local_28;
  uint local_1c;
  
  local_28 = *(_vtt_block_t **)(in_RDI + 0x20);
  local_1c = 1;
  for (; local_28 != (_vtt_block_t *)0x0; local_28 = local_28->next) {
    vtt_crack_time(local_28->timestamp,(int *)&local_2c,(int *)&local_34,(int *)&local_3c,
                   (int *)&local_44);
    vtt_crack_time(local_28->timestamp + local_28->duration,&local_30,&local_38,&local_40,&local_48)
    ;
    uVar9 = local_1c;
    uVar8 = local_2c;
    iVar7 = local_30;
    uVar6 = local_34;
    iVar5 = local_38;
    uVar4 = local_3c;
    iVar3 = local_40;
    uVar2 = local_44;
    iVar1 = local_48;
    puVar10 = vtt_block_data(local_28);
    printf("%02d\r\n%d:%02d:%02d,%03d --> %02d:%02d:%02d,%03d\r\n%s\r\n",(ulong)uVar9,(ulong)uVar8,
           (ulong)uVar6,(ulong)uVar4,(ulong)uVar2,iVar7,iVar5,iVar3,iVar1,puVar10);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void srt_dump(srt_t* srt)
{
    int i;
    vtt_block_t* block;

    for (block = srt->cue_head, i = 1; block; block = block->next, ++i) {
        int hh1, hh2, mm1, mm2, ss1, ss2, ms1, ms2;
        vtt_crack_time(block->timestamp, &hh1, &mm1, &ss1, &ms1);
        vtt_crack_time(block->timestamp + block->duration, &hh2, &mm2, &ss2, &ms2);

        printf("%02d\r\n%d:%02d:%02d,%03d --> %02d:%02d:%02d,%03d\r\n%s\r\n", i,
            hh1, mm1, ss1, ms1, hh2, mm2, ss2, ms2, vtt_block_data(block));
    }
}